

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O2

double FBX::getProperty<double>(Node *node,string *property,double *fallback)

{
  __type _Var1;
  variant_alternative_t<6UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *__lhs;
  variant_alternative_t<4UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar2;
  pointer pNVar3;
  variant_alternative_t<4UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  extraout_XMM0_Qa;
  Node properties;
  allocator<char> local_c1;
  variant_alternative_t<4UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  local_c0;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_b8;
  string local_a0;
  Node local_80;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"Properties70",&local_c1);
  findNodes(&local_b8,node,&local_a0);
  Node::Node(&local_80,
             local_b8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_b8);
  local_c0 = (variant_alternative_t<4UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
              )std::__cxx11::string::~string((string *)&local_a0);
  pNVar3 = local_80.children.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pNVar3 == local_80.children.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
LAB_00109428:
      if (pNVar3 == local_80.children.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        local_c0 = *fallback;
      }
      Node::~Node(&local_80);
      return local_c0;
    }
    __lhs = std::
            get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                      ((pNVar3->properties).
                       super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    _Var1 = std::operator==(__lhs,property);
    if (_Var1) {
      pvVar2 = std::
               get<4ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         ((pNVar3->properties).
                          super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
      local_c0 = *pvVar2;
      goto LAB_00109428;
    }
    pNVar3 = pNVar3 + 1;
    local_c0 = extraout_XMM0_Qa;
  } while( true );
}

Assistant:

static T getProperty(const Node &node, const std::string &property, const T &fallback) {
        const Node properties = findNodes(node, "Properties70")[0];

        for (const auto &prop : properties.children)
            if (std::get<std::string>(prop.properties[0]) == property)
                return std::get<T>(prop.properties[4]);
        return fallback;
    }